

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

pair<bool,_dg::LLVMPointsToSet> __thiscall
dg::DGLLVMPointerAnalysis::getLLVMPointsToChecked(DGLLVMPointerAnalysis *this,Value *val)

{
  bool bVar1;
  PSNode *pPVar2;
  pair<bool,_dg::LLVMPointsToSet> *this_00;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> extraout_RDX;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> extraout_RDX_00
  ;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> extraout_RDX_01
  ;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> uVar3;
  undefined8 in_RDI;
  pair<bool,_dg::LLVMPointsToSet> pVar4;
  PSNode *node;
  DGLLVMPointsToSet *pts;
  LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&> *in_stack_ffffffffffffff78;
  DGLLVMPointerAnalysis *in_stack_ffffffffffffff80;
  
  pPVar2 = getPointsToNode(in_stack_ffffffffffffff80,(Value *)in_stack_ffffffffffffff78);
  if (pPVar2 == (PSNode *)0x0) {
    this_00 = (pair<bool,_dg::LLVMPointsToSet> *)operator_new(0x30);
    getUnknownPTSet();
    DGLLVMPointsToSet::DGLLVMPointsToSet
              ((DGLLVMPointsToSet *)this_00,(PointsToSetT *)in_stack_ffffffffffffff78);
    LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>::toLLVMPointsToSet
              (in_stack_ffffffffffffff78);
    std::pair<bool,_dg::LLVMPointsToSet>::pair<bool,_dg::LLVMPointsToSet,_true>
              (this_00,(bool *)in_stack_ffffffffffffff78,(LLVMPointsToSet *)0x1503a3);
    LLVMPointsToSet::~LLVMPointsToSet((LLVMPointsToSet *)0x1503ad);
    uVar3._M_t.
    super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
    .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
         extraout_RDX_01._M_t.
         super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
  }
  else {
    bVar1 = pta::PointerIdPointsToSet::empty((PointerIdPointsToSet *)0x150287);
    if (bVar1) {
      operator_new(0x30);
      getUnknownPTSet();
      DGLLVMPointsToSet::DGLLVMPointsToSet
                ((DGLLVMPointsToSet *)in_stack_ffffffffffffff80,
                 (PointsToSetT *)in_stack_ffffffffffffff78);
      LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>::toLLVMPointsToSet
                (in_stack_ffffffffffffff78);
      std::pair<bool,_dg::LLVMPointsToSet>::pair<bool,_dg::LLVMPointsToSet,_true>
                ((pair<bool,_dg::LLVMPointsToSet> *)in_stack_ffffffffffffff80,
                 (bool *)in_stack_ffffffffffffff78,(LLVMPointsToSet *)0x1502e0);
      LLVMPointsToSet::~LLVMPointsToSet((LLVMPointsToSet *)0x1502ea);
      uVar3._M_t.
      super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
      _M_t.
      super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
      .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
           extraout_RDX._M_t.
           super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
           .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
    }
    else {
      operator_new(0x30);
      DGLLVMPointsToSet::DGLLVMPointsToSet
                ((DGLLVMPointsToSet *)in_stack_ffffffffffffff80,
                 (PointsToSetT *)in_stack_ffffffffffffff78);
      LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>::toLLVMPointsToSet
                (in_stack_ffffffffffffff78);
      std::pair<bool,_dg::LLVMPointsToSet>::pair<bool,_dg::LLVMPointsToSet,_true>
                ((pair<bool,_dg::LLVMPointsToSet> *)in_stack_ffffffffffffff80,
                 (bool *)in_stack_ffffffffffffff78,(LLVMPointsToSet *)0x150344);
      LLVMPointsToSet::~LLVMPointsToSet((LLVMPointsToSet *)0x15034e);
      uVar3._M_t.
      super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
      _M_t.
      super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
      .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
           extraout_RDX_00._M_t.
           super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
           .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
    }
  }
  pVar4.second._impl._M_t.
  super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
  super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
       (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
       (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
       uVar3._M_t.
       super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
       .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
  pVar4._0_8_ = in_RDI;
  return pVar4;
}

Assistant:

std::pair<bool, LLVMPointsToSet>
    getLLVMPointsToChecked(const llvm::Value *val) override {
        DGLLVMPointsToSet *pts;
        if (auto *node = getPointsToNode(val)) {
            if (node->pointsTo.empty()) {
                pts = new DGLLVMPointsToSet(getUnknownPTSet());
                return {false, pts->toLLVMPointsToSet()};
            }
            pts = new DGLLVMPointsToSet(node->pointsTo);
            return {true, pts->toLLVMPointsToSet()};
        }
        pts = new DGLLVMPointsToSet(getUnknownPTSet());
        return {false, pts->toLLVMPointsToSet()};
    }